

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

void qt_split_namespace(QString *prefix,QString *name,QString *qName,bool hasURI)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QString::indexOf(qName,(QChar)0x3a,0,CaseSensitive);
  if (qVar3 == -1) {
    if (hasURI) {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_58,L"",0);
      pDVar1 = (prefix->d).d;
      pcVar2 = (prefix->d).ptr;
      (prefix->d).d = local_58.d;
      (prefix->d).ptr = local_58.ptr;
      qVar3 = (prefix->d).size;
      (prefix->d).size = local_58.size;
      local_58.d = pDVar1;
      local_58.ptr = pcVar2;
      local_58.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    else {
      QString::clear(prefix);
    }
    QString::operator=(name,qName);
  }
  else {
    QString::left((QString *)&local_58,qName,qVar3);
    pDVar1 = (prefix->d).d;
    pcVar2 = (prefix->d).ptr;
    (prefix->d).d = local_58.d;
    (prefix->d).ptr = local_58.ptr;
    qVar3 = (prefix->d).size;
    (prefix->d).size = local_58.size;
    local_58.d = pDVar1;
    local_58.ptr = pcVar2;
    local_58.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QString::mid((longlong)&local_58,(longlong)qName);
    pDVar1 = (name->d).d;
    pcVar2 = (name->d).ptr;
    (name->d).d = local_58.d;
    (name->d).ptr = local_58.ptr;
    qVar3 = (name->d).size;
    (name->d).size = local_58.size;
    local_58.d = pDVar1;
    local_58.ptr = pcVar2;
    local_58.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_split_namespace(QString& prefix, QString& name, const QString& qName, bool hasURI)
{
    qsizetype i = qName.indexOf(u':');
    if (i == -1) {
        if (hasURI)
            prefix = u""_s;
        else
            prefix.clear();
        name = qName;
    } else {
        prefix = qName.left(i);
        name = qName.mid(i + 1);
    }
}